

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::rpc_session::read_complete(rpc_session *this,ptr<buffer> *hdr,ptr<buffer> *log_ctx)

{
  uint32_t uVar1;
  raft_server *this_00;
  asio_service_impl *paVar2;
  element_type *peVar3;
  element_type *peVar4;
  ulong this_01;
  byte bVar5;
  bool bVar6;
  int32 iVar7;
  uint uVar8;
  int32_t iVar9;
  int iVar10;
  size_t sVar11;
  void *pvVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  ulong size;
  log_val_type val_type;
  ptr<resp_msg> resp;
  int32 src;
  msg_type t;
  ConnectionArgs args;
  ptr<req_msg> req;
  int32 dst;
  ulong term_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  buffer_serializer ss;
  uint64_t timestamp;
  ulong commit_idx;
  ulong last_idx;
  ulong last_term;
  ulong term;
  ptr<rpc_session> self;
  string meta_str;
  __shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::rpc_session,void>
            ((__shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2> *)&self,
             (__weak_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *)this);
  buffer::pos((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,1);
  bVar5 = buffer::get_byte((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
  t = (msg_type)bVar5;
  src = buffer::get_int((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       );
  dst = buffer::get_int((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       );
  term = buffer::get_ulong((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
  last_term = buffer::get_ulong((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr);
  last_idx = buffer::get_ulong((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
  buffer::get_ulong((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  iVar10 = this->src_id_;
  if (iVar10 == -1) {
    this->src_id_ = src;
    invoke_connection_callback(this,true);
  }
  else if ((this->is_leader_ == true) &&
          (iVar7 = raft_server::get_leader
                             ((this->handler_).
                              super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr), iVar10 != iVar7)) {
    this->is_leader_ = false;
  }
  if (((this->is_leader_ == false) && (t < custom_notification_response)) &&
     ((0x11015408U >> (t & (custom_notification_request|append_entries_request)) & 1) != 0)) {
    this->is_leader_ = true;
    args.sessionId = this->session_id_;
    uVar1 = this->cached_port_;
    iVar7 = this->src_id_;
    std::__cxx11::string::string((string *)&args.address,(string *)&this->cached_address_);
    args.srvId = iVar7;
    args.port = uVar1;
    args.isLeader = true;
    this_00 = (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    iVar7 = this_00->id_;
    meta_str._M_dataplus._M_p._4_4_ = raft_server::get_leader(this_00);
    meta_str._M_dataplus._M_p._0_4_ = iVar7;
    meta_str._M_string_length = CONCAT44(meta_str._M_string_length._4_4_,0xffffffff);
    meta_str.field_2._M_allocated_capacity = (size_type)&args;
    raft_server::invoke_callback
              ((this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,NewSessionFromLeader,(Param *)&meta_str);
    std::__cxx11::string::~string((string *)&args.address);
  }
  meta_str._M_dataplus._M_p = (pointer)&meta_str.field_2;
  meta_str._M_string_length = 0;
  meta_str.field_2._M_allocated_capacity =
       meta_str.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::
  make_shared<nuraft::req_msg,unsigned_long&,nuraft::msg_type&,int&,int&,unsigned_long&,unsigned_long&,unsigned_long&>
            ((unsigned_long *)&req,(msg_type *)&term,(int *)&t,&src,(unsigned_long *)&dst,&last_term
             ,&last_idx);
  iVar7 = buffer::get_int((hdr->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
  if ((0 < iVar7) &&
     ((log_ctx->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0)) {
    buffer_serializer::buffer_serializer(&ss,log_ctx,LITTLE);
    sVar11 = buffer::size((log_ctx->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
    uVar8 = this->flags_;
    if ((uVar8 & 1) != 0) {
      resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      pvVar12 = buffer_serializer::get_bytes(&ss,(size_t *)&resp);
      if (resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        args.sessionId = (uint64_t)&args.address._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&args,pvVar12,
                   (long)&((resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_msg_base)._vptr_msg_base + (long)pvVar12);
        std::__cxx11::string::operator=((string *)&meta_str,(string *)&args);
        std::__cxx11::string::~string((string *)&args);
      }
      uVar8 = this->flags_;
    }
    while (ss.pos_ < sVar11) {
      if (sVar11 - ss.pos_ < (ulong)(uVar8 & 4) * 2 + 0xd) {
        peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar4 != (element_type *)0x0) && (iVar10 = (*peVar4->_vptr_logger[7])(), 2 < iVar10))
        {
          peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&args,"wrong log ctx size %zu pos %zu, stop this session",sVar11,
                     ss.pos_);
          (*peVar4->_vptr_logger[8])
                    (peVar4,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                     ,"read_complete",0x21b,&args);
          std::__cxx11::string::~string((string *)&args);
        }
        stop(this);
        goto LAB_001d5c27;
      }
      term_1 = buffer_serializer::get_u64(&ss);
      val_type = buffer_serializer::get_u8(&ss);
      if ((this->flags_ & 4) != 0) {
        buffer_serializer::get_u64(&ss);
      }
      iVar9 = buffer_serializer::get_i32(&ss);
      size = (ulong)iVar9;
      if (sVar11 - ss.pos_ < size) {
        peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar4 != (element_type *)0x0) && (iVar10 = (*peVar4->_vptr_logger[7])(), 2 < iVar10))
        {
          peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&args,"wrong value size %zu log ctx %zu %zu, stop this session",size,
                     sVar11,ss.pos_);
          (*peVar4->_vptr_logger[8])
                    (peVar4,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                     ,"read_complete",0x228,&args);
          std::__cxx11::string::~string((string *)&args);
        }
        stop(this);
        goto LAB_001d5c27;
      }
      buffer::alloc((buffer *)&args,size);
      buffer_serializer::get_buffer(&ss,(ptr<buffer> *)&args);
      std::
      make_shared<nuraft::log_entry,unsigned_long&,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type&,unsigned_long&>
                ((unsigned_long *)&resp,(shared_ptr<nuraft::buffer> *)&term_1,(log_val_type *)&args,
                 (unsigned_long *)&val_type);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::push_back(&(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   log_entries_,(value_type *)&resp);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&args.address);
    }
  }
  paVar2 = this->impl_;
  if (((paVar2->my_opt_).read_req_meta_.super__Function_base._M_manager != (_Manager_type)0x0) &&
     ((meta_str._M_string_length != 0 || ((paVar2->my_opt_).invoke_req_cb_on_empty_meta_ == true))))
  {
    args._40_8_ = (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  commit_idx_;
    args.address._M_string_length =
         ((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_msg_base).term_;
    args.sessionId._0_4_ =
         ((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_msg_base).type_;
    args.sessionId._4_4_ =
         ((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_msg_base).src_;
    args.address._M_dataplus._M_p._0_4_ =
         ((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_msg_base).dst_;
    args.address.field_2._M_allocated_capacity =
         (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         last_log_term_;
    args.address.field_2._8_8_ =
         (req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->last_log_idx_
    ;
    bVar6 = std::
            function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&(paVar2->my_opt_).read_req_meta_,(asio_service_meta_cb_params *)&args,
                         &meta_str);
    if (!bVar6) {
      stop(this);
      goto LAB_001d5c27;
    }
  }
  peVar3 = (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  args.address.field_2._8_8_ = 0;
  args.port = 0;
  args.srvId = 0;
  args.address._M_string_length = 0;
  args.address.field_2._M_allocated_capacity = 0;
  args.sessionId = 0;
  args.address._M_dataplus._M_p = (pointer)0x0;
  (*peVar3->_vptr_raft_server[2])
            (&resp,peVar3,req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::_Function_base::~_Function_base((_Function_base *)&args);
  if (resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar4 != (element_type *)0x0) && (iVar10 = (*peVar4->_vptr_logger[7])(), 2 < iVar10)) {
      peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&args,"no response is returned from raft message handler");
      (*peVar4->_vptr_logger[8])
                (peVar4,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"read_complete",0x244,&args);
      std::__cxx11::string::~string((string *)&args);
    }
    stop(this);
  }
  else {
    if (((resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        async_cb_func_).super__Function_base._M_manager == (_Manager_type)0x0) {
      if (((resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cb_func_)
          .super__Function_base._M_manager != (_Manager_type)0x0) {
        resp_msg::call_cb((resp_msg *)&args,
                          (ptr<resp_msg> *)
                          resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
        std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)&args);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&args.address);
      }
      std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,&resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>);
      on_resp_ready(this,(ptr<req_msg> *)&local_40,(ptr<resp_msg> *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      this_02 = &local_40._M_refcount;
    }
    else {
      std::
      function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
      ::operator()((function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
                    *)&term_1);
      this_01 = term_1;
      args.sessionId = (uint64_t)this;
      std::__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *)&args.address,
                 &self.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)&args.address.field_2,
                 &req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)&args.port,
                 &resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>);
      std::
      function<void(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>&,std::shared_ptr<std::exception>&)>
      ::
      function<nuraft::rpc_session::read_complete(std::shared_ptr<nuraft::buffer>,std::shared_ptr<nuraft::buffer>)::_lambda(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>&,std::shared_ptr<std::exception>&)_1_,void>
                ((function<void(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>&,std::shared_ptr<std::exception>&)>
                  *)&ss,(anon_class_56_4_aa7ddfaa *)&args);
      cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::when_ready
                ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                 this_01,(handler_type2 *)&ss);
      std::_Function_base::~_Function_base((_Function_base *)&ss);
      read_complete(std::shared_ptr<nuraft::buffer>,std::shared_ptr<nuraft::buffer>)::
      {lambda(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>&,std::shared_ptr<std::exception>&)#1}
      ::~cmd_result((_lambda_nuraft__cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>__std__shared_ptr<std::exception>___1_
                     *)&args);
      this_02 = &local_d8;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_02);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_001d5c27:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&meta_str);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&self.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void read_complete(ptr<buffer> hdr, ptr<buffer> log_ctx) {
        ptr<rpc_session> self = this->shared_from_this();

       try {
        hdr->pos(1);
        msg_type t = (msg_type)hdr->get_byte();
        int32 src = hdr->get_int();
        int32 dst = hdr->get_int();
        ulong term = hdr->get_ulong();
        ulong last_term = hdr->get_ulong();
        ulong last_idx = hdr->get_ulong();
        ulong commit_idx = hdr->get_ulong();

        if (src_id_ == -1) {
            // It means this is the first message on this session.
            // Invoke callback function of new connection.
            src_id_ = src;
            invoke_connection_callback(true);

        } else if (is_leader_ && src_id_ != handler_->get_leader()) {
            // Leader has been changed without closing session.
            is_leader_ = false;
        }

        if (!is_leader_) {
            // If leader flag is not set, we identify whether the endpoint
            // server is leader based on the message type (only leader
            // can send below message types).
            if ( t == msg_type::append_entries_request ||
                 t == msg_type::sync_log_request ||
                 t == msg_type::join_cluster_request ||
                 t == msg_type::leave_cluster_request ||
                 t == msg_type::install_snapshot_request ||
                 t == msg_type::priority_change_request ||
                 t == msg_type::custom_notification_request ) {
                is_leader_ = true;
                cb_func::ConnectionArgs
                    args( session_id_,
                          cached_address_,
                          cached_port_,
                          src_id_,
                          is_leader_ );
                cb_func::Param cb_param( handler_->get_id(),
                                         handler_->get_leader(),
                                         -1,
                                         &args );
                handler_->invoke_callback( cb_func::NewSessionFromLeader,
                                           &cb_param );
            }
        }

        std::string meta_str;
        ptr<req_msg> req = cs_new<req_msg>
                           ( term, t, src, dst, last_term, last_idx, commit_idx );
        if (hdr->get_int() > 0 && log_ctx) {
            buffer_serializer ss(log_ctx);
            size_t log_ctx_size = log_ctx->size();

            // If flag is set, read meta first.
            if (flags_ & INCLUDE_META) {
                size_t meta_len = 0;
                const byte* meta_raw = (const byte*)ss.get_bytes(meta_len);
                if (meta_len) {
                    meta_str = std::string((const char*)meta_raw, meta_len);
                }
            }

            size_t LOG_ENTRY_SIZE = 8 + 1 + 4;
            if (flags_ & INCLUDE_LOG_TIMESTAMP) {
                LOG_ENTRY_SIZE += 8;
            }

            while (log_ctx_size > ss.pos()) {
                if (log_ctx_size - ss.pos() < LOG_ENTRY_SIZE) {
                    // Possibly corrupted packet. Stop here.
                    p_wn("wrong log ctx size %zu pos %zu, stop this session",
                         log_ctx_size, ss.pos());
                    this->stop();
                    return;
                }
                ulong term = ss.get_u64();
                log_val_type val_type = (log_val_type)ss.get_u8();
                uint64_t timestamp = (flags_ & INCLUDE_LOG_TIMESTAMP) ? ss.get_u64() : 0;

                size_t val_size = ss.get_i32();
                if (log_ctx_size - ss.pos() < val_size) {
                    // Out-of-bound size.
                    p_wn("wrong value size %zu log ctx %zu %zu, "
                         "stop this session",
                         val_size, log_ctx_size, ss.pos());
                    this->stop();
                    return;
                }

                ptr<buffer> buf( buffer::alloc(val_size) );
                ss.get_buffer(buf);
                ptr<log_entry> entry(
                    cs_new<log_entry>(term, buf, val_type, timestamp) );
                req->log_entries().push_back(entry);
            }
        }

        // If callback is given, verify meta
        // (if meta is empty, invoke callback according to the flag).
        if ( impl_->get_options().read_req_meta_ &&
             ( !meta_str.empty() ||
               impl_->get_options().invoke_req_cb_on_empty_meta_ ) ) {
            if ( !impl_->get_options().read_req_meta_
                  ( req_to_params(req), meta_str ) ) {
                this->stop();
                return;
            }
        }

        // === RAFT server processes the request here. ===
        ptr<resp_msg> resp = raft_server_handler::process_req(handler_.get(), *req);
        if (!resp) {
            p_wn("no response is returned from raft message handler");
            this->stop();
            return;
        }

        if (resp->has_async_cb()) {
            // Response will be ready later, setup a callback function
            // (only for auto-forwarding with `client_request` type
            //  in async handling mode).
            ptr< cmd_result< ptr<buffer> > > ret = resp->call_async_cb();

            // WARNING: `self` should be captured to avoid releasing this `rpc_session`.
            ret->when_ready(
                [this, self, req, resp]
                ( cmd_result<ptr<buffer>, ptr<std::exception>>& res,
                  ptr<std::exception>& exp ) {
                    resp->set_ctx(res.get());
                    on_resp_ready(req, resp);
                    // This is needed to avoid circular reference.
                    res.reset();
                }
            );

        } else {
            // Response should already be ready when we reach here.
            if (resp->has_cb()) {
                // If callback function exists, get new response message.
                resp = resp->call_cb(resp);
            }
            on_resp_ready(req, resp);
        }

       } catch (std::exception& ex) {
        p_er( "session %" PRIu64 " failed to process request message "
              "due to error: %s",
              this->session_id_,
              ex.what() );
        this->stop();
       }
    }